

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall
re2::Prog::SearchDFA
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match0,bool *failed,vector<int,_std::allocator<int>_> *matches)

{
  bool bVar1;
  undefined1 uVar2;
  bool bVar3;
  DFA *this_00;
  MatchKind MVar4;
  char *pcVar5;
  int iVar7;
  byte bVar8;
  byte bVar9;
  StringPiece context;
  char *ep;
  StringPiece *local_38;
  long lVar6;
  
  *failed = false;
  context.ptr_ = const_context->ptr_;
  context.length_ = const_context->length_;
  context._12_4_ = *(undefined4 *)&const_context->field_0xc;
  if (context.ptr_ == (char *)0x0) {
    context.length_ = text->length_;
    context.ptr_ = text->ptr_;
  }
  uVar2 = this->anchor_start_;
  bVar1 = this->anchor_end_;
  bVar8 = uVar2;
  bVar9 = bVar1;
  if (this->reversed_ != false) {
    bVar8 = bVar1;
    bVar9 = uVar2;
  }
  if (((bVar8 == 1) && (context.ptr_ != text->ptr_)) ||
     ((bVar9 != 0 && (context.ptr_ + context.length_ != text->ptr_ + text->length_)))) {
    return false;
  }
  bVar9 = true;
  if (anchor != kAnchored) {
    bVar9 = kind == kFullMatch | uVar2;
  }
  if (kind == kFullMatch) {
LAB_0013e833:
    MVar4 = kLongestMatch;
  }
  else {
    MVar4 = kind;
    if (kind != kManyMatch) {
      if (bVar1 == false) {
        MVar4 = kLongestMatch;
        bVar8 = 1;
        bVar1 = false;
        goto LAB_0013e842;
      }
      goto LAB_0013e833;
    }
  }
  bVar1 = true;
  bVar8 = 0;
  kind = MVar4;
LAB_0013e842:
  if (match0 == (StringPiece *)0x0) {
    kind = MVar4;
  }
  local_38 = match0;
  this_00 = GetDFA(this,kind);
  bVar3 = DFA::Search(this_00,text,&context,(bool)bVar9,(bool)(match0 == (StringPiece *)0x0 & bVar8)
                      ,(bool)(this->reversed_ ^ 1),failed,&ep,matches);
  if (bVar3) {
    if (*failed != false) {
      return false;
    }
    if (bVar1) {
      bVar9 = this->reversed_;
      lVar6 = 0;
      if ((bool)bVar9 == false) {
        lVar6 = (long)text->length_;
      }
      pcVar5 = text->ptr_ + lVar6;
      if (local_38 == (StringPiece *)0x0) {
        return ep == pcVar5;
      }
      if (ep != pcVar5) {
        return ep == pcVar5;
      }
    }
    else {
      if (local_38 == (StringPiece *)0x0) {
        return true;
      }
      bVar9 = this->reversed_;
    }
    iVar7 = text->length_ + (int)text->ptr_;
    if ((bVar9 & 1) == 0) {
      iVar7 = (int)ep;
      ep = text->ptr_;
    }
    local_38->ptr_ = ep;
    local_38->length_ = iVar7 - (int)ep;
    return true;
  }
  return false;
}

Assistant:

bool Prog::SearchDFA(const StringPiece& text, const StringPiece& const_context,
                     Anchor anchor, MatchKind kind,
                     StringPiece* match0, bool* failed, vector<int>* matches) {
  *failed = false;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;
  bool carat = anchor_start();
  bool dollar = anchor_end();
  if (reversed_) {
    bool t = carat;
    carat = dollar;
    dollar = t;
  }
  if (carat && context.begin() != text.begin())
    return false;
  if (dollar && context.end() != text.end())
    return false;

  // Handle full match by running an anchored longest match
  // and then checking if it covers all of text.
  bool anchored = anchor == kAnchored || anchor_start() || kind == kFullMatch;
  bool endmatch = false;
  if (kind == kManyMatch) {
    endmatch = true;
  } else if (kind == kFullMatch || anchor_end()) {
    endmatch = true;
    kind = kLongestMatch;
  }

  // If the caller doesn't care where the match is (just whether one exists),
  // then we can stop at the very first match we find, the so-called
  // "shortest match".
  bool want_shortest_match = false;
  if (match0 == NULL && !endmatch) {
    want_shortest_match = true;
    kind = kLongestMatch;
  }

  DFA* dfa = GetDFA(kind);
  const char* ep;
  bool matched = dfa->Search(text, context, anchored,
                             want_shortest_match, !reversed_,
                             failed, &ep, matches);
  if (*failed)
    return false;
  if (!matched)
    return false;
  if (endmatch && ep != (reversed_ ? text.begin() : text.end()))
    return false;

  // If caller cares, record the boundary of the match.
  // We only know where it ends, so use the boundary of text
  // as the beginning.
  if (match0) {
    if (reversed_)
      match0->set(ep, static_cast<int>(text.end() - ep));
    else
      match0->set(text.begin(), static_cast<int>(ep - text.begin()));
  }
  return true;
}